

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_IncorrectConstructionVectorAsFlag_Test::TestBody
          (TApp_IncorrectConstructionVectorAsFlag_Test *this)

{
  bool bVar1;
  Option *this_00;
  AssertHelper AStack_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  vector<int,_std::allocator<int>_> x;
  string local_50;
  string local_30;
  
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_30,"--cat",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&AStack_78);
  this_00 = CLI::App::add_option<int>(&(this->super_TApp).app,&local_30,&x,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::Option::expected(this_00,0);
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x95,
             "Expected: cat->expected(0) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_70);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&x.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionVectorAsFlag) {
    std::vector<int> x;
    auto cat = app.add_option("--cat", x);
    EXPECT_THROW(cat->expected(0), CLI::IncorrectConstruction);
}